

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O0

int smf::eventcompare(void *a,void *b)

{
  MidiMessage *this;
  MidiMessage *this_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  MidiEvent *bevent;
  MidiEvent *aevent;
  void *b_local;
  void *a_local;
  
  this = *a;
  this_00 = *b;
  if (*(int *)&this_00[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start <
      *(int *)&this[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start) {
    a_local._4_4_ = 1;
  }
  else if (*(int *)&this[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start <
           *(int *)&this_00[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start) {
    a_local._4_4_ = -1;
  }
  else if (((*(int *)&this[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage == 0) ||
           (*(int *)&this_00[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage == 0)) ||
          (*(int *)&this[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage <=
           *(int *)&this_00[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage)) {
    if (((*(int *)&this[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage == 0) ||
        (*(int *)&this_00[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage == 0)) ||
       (*(int *)&this_00[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage <=
        *(int *)&this[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage)) {
      iVar1 = MidiMessage::getP0(this);
      if ((iVar1 == 0xff) && (iVar1 = MidiMessage::getP1(this), iVar1 == 0x2f)) {
        return 1;
      }
      iVar1 = MidiMessage::getP0(this_00);
      if ((iVar1 == 0xff) && (iVar1 = MidiMessage::getP1(this_00), iVar1 == 0x2f)) {
        return -1;
      }
      iVar1 = MidiMessage::getP0(this);
      if ((iVar1 == 0xff) && (iVar1 = MidiMessage::getP0(this_00), iVar1 != 0xff)) {
        return -1;
      }
      iVar1 = MidiMessage::getP0(this);
      if ((iVar1 != 0xff) && (iVar1 = MidiMessage::getP0(this_00), iVar1 == 0xff)) {
        return 1;
      }
      uVar2 = MidiMessage::getP0(this);
      if (((uVar2 & 0xf0) == 0x90) && (iVar1 = MidiMessage::getP2(this), iVar1 != 0)) {
        return 1;
      }
      uVar2 = MidiMessage::getP0(this_00);
      if (((uVar2 & 0xf0) == 0x90) && (iVar1 = MidiMessage::getP2(this_00), iVar1 != 0)) {
        return -1;
      }
      uVar2 = MidiMessage::getP0(this);
      if (((uVar2 & 0xf0) != 0x90) && (uVar2 = MidiMessage::getP0(this), (uVar2 & 0xf0) != 0x80)) {
        uVar2 = MidiMessage::getP0(this_00);
        if (((uVar2 & 0xf0) == 0x90) ||
           (uVar2 = MidiMessage::getP0(this_00), (uVar2 & 0xf0) == 0x80)) {
          return -1;
        }
        uVar2 = MidiMessage::getP0(this);
        if (((uVar2 & 0xf0) != 0xb0) ||
           (uVar2 = MidiMessage::getP0(this_00), (uVar2 & 0xf0) != 0xb0)) {
          return 0;
        }
        iVar1 = MidiMessage::getP1(this);
        iVar3 = MidiMessage::getP1(this_00);
        if (iVar3 < iVar1) {
          return 1;
        }
        iVar1 = MidiMessage::getP1(this);
        iVar3 = MidiMessage::getP1(this_00);
        if (iVar1 < iVar3) {
          return -1;
        }
        iVar1 = MidiMessage::getP2(this);
        iVar3 = MidiMessage::getP2(this_00);
        if (iVar3 < iVar1) {
          return 1;
        }
        iVar1 = MidiMessage::getP2(this);
        iVar3 = MidiMessage::getP2(this_00);
        if (iVar1 < iVar3) {
          return -1;
        }
        return 0;
      }
      a_local._4_4_ = 1;
    }
    else {
      a_local._4_4_ = -1;
    }
  }
  else {
    a_local._4_4_ = 1;
  }
  return a_local._4_4_;
}

Assistant:

int eventcompare(const void* a, const void* b) {
	MidiEvent& aevent = **((MidiEvent**)a);
	MidiEvent& bevent = **((MidiEvent**)b);

	if (aevent.tick > bevent.tick) {
		// aevent occurs after bevent
		return +1;
	} else if (aevent.tick < bevent.tick) {
		// aevent occurs before bevent
		return -1;
	} else if ((aevent.seq != 0) && (bevent.seq != 0) && (aevent.seq > bevent.seq)) {
		// aevent sequencing state occurs after bevent
		// see MidiEventList::markSequence()
		return +1;
	} else if ((aevent.seq != 0) && (bevent.seq != 0) && (aevent.seq < bevent.seq)) {
		// aevent sequencing state occurs before bevent
		// see MidiEventList::markSequence()
		return -1;
	} else if (aevent.getP0() == 0xff && aevent.getP1() == 0x2f) {
		// end-of-track meta-message should always be last (but won't really
		// matter since the writing function ignores all end-of-track messages
		// and writes its own.
		return +1;
	} else if (bevent.getP0() == 0xff && bevent.getP1() == 0x2f) {
		// end-of-track meta-message should always be last (but won't really
		// matter since the writing function ignores all end-of-track messages
		// and writes its own.
		return -1;
	} else if (aevent.getP0() == 0xff && bevent.getP0() != 0xff) {
		// other meta-messages are placed before real MIDI messages
		return -1;
	} else if (aevent.getP0() != 0xff && bevent.getP0() == 0xff) {
		// other meta-messages are placed before real MIDI messages
		return +1;
	} else if (((aevent.getP0() & 0xf0) == 0x90) && (aevent.getP2() != 0)) {
		// note-ons come after all other types of MIDI messages
		return +1;
	} else if (((bevent.getP0() & 0xf0) == 0x90) && (bevent.getP2() != 0)) {
		// note-ons come after all other types of MIDI messages
		return -1;
	} else if (((aevent.getP0() & 0xf0) == 0x90) || ((aevent.getP0() & 0xf0) == 0x80)) {
		// note-offs come after all other MIDI messages (except note-ons)
		return +1;
	} else if (((bevent.getP0() & 0xf0) == 0x90) || ((bevent.getP0() & 0xf0) == 0x80)) {
		// note-offs come after all other MIDI messages (except note-ons)
		return -1;
	} else if (((aevent.getP0() & 0xf0) == 0xb0) && ((bevent.getP0() & 0xf0) == 0xb0)) {
		// both events are continuous controllers.  Sort them by controller number
		if (aevent.getP1() > bevent.getP1()) {
			return +1;
		} if (aevent.getP1() < bevent.getP1()) {
			return -1;
		} else {
			// same controller number, so sort by data value
			if (aevent.getP2() > bevent.getP2()) {
				return +1;
			} if (aevent.getP2() < bevent.getP2()) {
				return -1;
			} else {
				return 0;
			}
		}
	} else {
		return 0;
	}
}